

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O3

void __thiscall
json11::
Value<(json11::Json::Type)5,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>_>
::dump(Value<(json11::Json::Type)5,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_json11::Json>_>_>_>
       *this,string *out)

{
  bool bVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  
  std::__cxx11::string::append((char *)out);
  p_Var2 = (this->m_value)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->m_value)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var3) {
    bVar1 = true;
    do {
      if (!bVar1) {
        std::__cxx11::string::append((char *)out);
      }
      json11::dump((string *)(p_Var2 + 1),out);
      std::__cxx11::string::append((char *)out);
      (**(code **)(**(long **)(p_Var2 + 2) + 0x18))(*(long **)(p_Var2 + 2),out);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
      bVar1 = false;
    } while ((_Rb_tree_header *)p_Var2 != p_Var3);
  }
  std::__cxx11::string::append((char *)out);
  return;
}

Assistant:

void dump(string &out) const override { json11::dump(m_value, out); }